

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

void __thiscall Graph<Node>::addEdge(Graph<Node> *this,Edge *edge)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Node local_30;
  Node local_28;
  
  this->_edgeCnt = this->_edgeCnt + 1;
  vector<Edge>::push_back(&this->edges,edge);
  iVar1 = edge->_nodeS;
  local_28._index = edge->_nodeD;
  lVar3 = (long)local_28._index;
  iVar2 = edge->_cost;
  local_28._costTo = iVar2;
  vector<Node>::push_back(&(this->G).vect[iVar1].nodes,&local_28);
  local_30._index = iVar1;
  local_30._costTo = iVar2;
  vector<Node>::push_back(&(this->G).vect[lVar3].nodes,&local_30);
  return;
}

Assistant:

inline void addEdge(const Edge &edge) {
        ++_edgeCnt;
        edges.push_back(edge);

        int source = edge.getSource();
        int dest = edge.getDest();
        int cost = edge.getCost();

//        if (source < size() or dest < size()) {
//            resize(max(source, dest));
//        }

        G[source].push_back(NodeT(dest, cost));
        G[dest].push_back(NodeT(source, cost));
    }